

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::DeathRespawn(Character *this)

{
  World *pWVar1;
  EOClient *pEVar2;
  bool bVar3;
  uchar uVar4;
  short sVar5;
  mapped_type *pmVar6;
  Map *pMVar7;
  double dVar8;
  allocator<char> local_6b;
  char local_6a [2];
  PacketReader local_68;
  string local_40;
  double local_20;
  
  local_20 = (double)this->maxhp;
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"DeathRecover",(allocator<char> *)&local_40);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,&local_68.data);
  dVar8 = util::variant::GetFloat(pmVar6);
  this->hp = (int)((dVar8 * local_20) / 100.0);
  std::__cxx11::string::~string((string *)&local_68);
  pWVar1 = this->world;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Deadly",(allocator<char> *)&local_40);
  pmVar6 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,&local_68.data);
  bVar3 = util::variant::GetBool(pmVar6);
  std::__cxx11::string::~string((string *)&local_68);
  if (bVar3) {
    DropAll(this,(Character *)0x0);
  }
  Map::Leave(this->map,this,WARP_ANIMATION_NONE,true);
  this->nowhere = true;
  pWVar1 = this->world;
  sVar5 = SpawnMap(this);
  pMVar7 = World::GetMap(pWVar1,sVar5);
  this->map = pMVar7;
  sVar5 = SpawnMap(this);
  this->mapid = sVar5;
  uVar4 = SpawnX(this);
  this->x = uVar4;
  uVar4 = SpawnY(this);
  this->y = uVar4;
  pEVar2 = this->player->client;
  local_6a[0] = -0x80;
  local_6a[1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,local_6a,&local_6b);
  PacketReader::PacketReader(&local_68,&local_40);
  ActionQueue::AddAction(&pEVar2->queue,&local_68,1.5,false);
  PacketReader::~PacketReader(&local_68);
  std::__cxx11::string::~string((string *)&local_40);
  pEVar2 = this->player->client;
  local_6a[0] = -0x7f;
  local_6a[1] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,local_6a,&local_6b);
  PacketReader::PacketReader(&local_68,&local_40);
  ActionQueue::AddAction(&pEVar2->queue,&local_68,0.0,false);
  PacketReader::~PacketReader(&local_68);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void Character::DeathRespawn()
{
	this->hp = int(this->maxhp * static_cast<double>(this->world->config["DeathRecover"]) / 100.0);

	if (this->world->config["Deadly"])
	{
		this->DropAll(nullptr);
	}

	this->map->Leave(this, WARP_ANIMATION_NONE, true);
	this->nowhere = true;
	this->map = this->world->GetMap(this->SpawnMap());
	this->mapid = this->SpawnMap();
	this->x = this->SpawnX();
	this->y = this->SpawnY();

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_NULL), char(PACKET_INTERNAL)}
	}.data()), 1.5);

	this->player->client->queue.AddAction(PacketReader(std::array<char, 2>{
		{char(PACKET_INTERNAL_WARP), char(PACKET_INTERNAL)}
	}.data()), 0.0);
}